

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

int mbedtls_blowfish_crypt_ecb(mbedtls_blowfish_context *ctx,int mode,uchar *input,uchar *output)

{
  uint uVar1;
  ulong uVar2;
  uint local_20;
  uint local_1c;
  
  uVar1 = *(uint *)input;
  local_1c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(input + 4);
  local_20 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (mode == 0) {
    uVar2 = 0x12;
    do {
      uVar1 = local_1c ^ ctx->P[uVar2 - 1];
      local_1c = (*(int *)((long)ctx->S[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) +
                  ctx->S[0][uVar1 >> 0x18] ^ ctx->S[2][uVar1 >> 8 & 0xff]) + ctx->S[3][uVar1 & 0xff]
                 ^ local_20;
      uVar2 = uVar2 - 1;
      local_20 = uVar1;
    } while (2 < uVar2);
    local_20 = local_1c ^ ctx->P[1];
    local_1c = uVar1 ^ ctx->P[0];
  }
  else {
    blowfish_enc(ctx,&local_1c,&local_20);
  }
  *output = (uchar)(local_1c >> 0x18);
  output[1] = (uchar)(local_1c >> 0x10);
  output[2] = (uchar)(local_1c >> 8);
  output[3] = (uchar)local_1c;
  output[4] = (uchar)(local_20 >> 0x18);
  output[5] = (uchar)(local_20 >> 0x10);
  output[6] = (uchar)(local_20 >> 8);
  output[7] = (uchar)local_20;
  return 0;
}

Assistant:

int mbedtls_blowfish_crypt_ecb( mbedtls_blowfish_context *ctx,
                    int mode,
                    const unsigned char input[MBEDTLS_BLOWFISH_BLOCKSIZE],
                    unsigned char output[MBEDTLS_BLOWFISH_BLOCKSIZE] )
{
    uint32_t X0, X1;

    GET_UINT32_BE( X0, input,  0 );
    GET_UINT32_BE( X1, input,  4 );

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        blowfish_dec( ctx, &X0, &X1 );
    }
    else /* MBEDTLS_BLOWFISH_ENCRYPT */
    {
        blowfish_enc( ctx, &X0, &X1 );
    }

    PUT_UINT32_BE( X0, output,  0 );
    PUT_UINT32_BE( X1, output,  4 );

    return( 0 );
}